

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluate.c
# Opt level: O0

symbol * evaluate_offsetof(dmr_C *C,expression *expr)

{
  expression *C_00;
  uint klass_00;
  int value;
  expression *peVar1;
  symbol *psVar2;
  expression *copy;
  symbol *psStack_60;
  int i_class;
  symbol *i_type;
  expression *m;
  expression *idx;
  symbol *psStack_40;
  int offset;
  symbol *field;
  symbol *psStack_30;
  int klass;
  symbol *ctype;
  expression *e;
  expression *expr_local;
  dmr_C *C_local;
  
  ctype = (symbol *)(expr->field_5).field_2.string;
  psStack_30 = (expr->field_5).field_4.symbol;
  e = expr;
  expr_local = (expression *)C;
  if (expr->op == 0x2e) {
    idx._4_4_ = 0;
    if (psStack_30 == (symbol *)0x0) {
      dmrC_expression_error(C,expr,"expected structure or union");
      return (symbol *)0x0;
    }
    dmrC_examine_symbol_type(C->S,psStack_30);
    field._4_4_ = classify_type((dmr_C *)expr_local,psStack_30,&stack0xffffffffffffffd0);
    if (field._4_4_ != 0x20) {
      dmrC_expression_error((dmr_C *)expr_local,e,"expected structure or union");
      return (symbol *)0x0;
    }
    psStack_40 = find_identifier((dmr_C *)expr_local,(ident *)(e->field_5).field_10.cond_false,
                                 (psStack_30->field_14).field_2.symbol_list,(int *)((long)&idx + 4))
    ;
    if (psStack_40 == (symbol *)0x0) {
      dmrC_expression_error((dmr_C *)expr_local,e,"unknown member");
      return (symbol *)0x0;
    }
    *(ushort *)e = *(ushort *)e & 0xff00 | 1;
    *(ushort *)e = *(ushort *)e & 0xff | 0x100;
    *(long *)&e->field_5 = (long)idx._4_4_;
    (e->field_5).field_0.taint = 0;
    e->ctype = (symbol *)**(undefined8 **)expr_local;
    psStack_30 = psStack_40;
  }
  else {
    if (psStack_30 == (symbol *)0x0) {
      dmrC_expression_error(C,expr,"expected structure or union");
      return (symbol *)0x0;
    }
    dmrC_examine_symbol_type(C->S,psStack_30);
    field._4_4_ = classify_type((dmr_C *)expr_local,psStack_30,&stack0xffffffffffffffd0);
    if (field._4_4_ != 0x30) {
      dmrC_expression_error((dmr_C *)expr_local,e,"expected array");
      return (symbol *)0x0;
    }
    psStack_30 = (psStack_30->field_14).field_2.ctype.base_type;
    if ((e->field_5).field_10.cond_false == (expression *)0x0) {
      *(ushort *)e = *(ushort *)e & 0xff00 | 1;
      *(ushort *)e = *(ushort *)e & 0xff | 0x100;
      (e->field_5).field_0.value = 0;
      (e->field_5).field_0.taint = 0;
      e->ctype = (symbol *)**(undefined8 **)expr_local;
    }
    else {
      m = (e->field_5).field_10.cond_false;
      psStack_60 = dmrC_evaluate_expression((dmr_C *)expr_local,m);
      klass_00 = classify_type((dmr_C *)expr_local,psStack_60,&stack0xffffffffffffffa0);
      if ((klass_00 & 9) != 1) {
        dmrC_expression_error((dmr_C *)expr_local,e,"non-integer index");
        return (symbol *)0x0;
      }
      unrestrict((dmr_C *)expr_local,m,klass_00,&stack0xffffffffffffffa0);
      m = cast_to((dmr_C *)expr_local,m,(symbol *)**(undefined8 **)expr_local);
      C_00 = expr_local;
      peVar1 = e;
      value = dmrC_bits_to_bytes(*(target_t **)expr_local,(psStack_30->field_14).field_1.normal);
      i_type = (symbol *)dmrC_alloc_const_expression((dmr_C *)C_00,peVar1->pos,value);
      *(undefined8 *)&(i_type->endpos).field_0x4 = **(undefined8 **)expr_local;
      *(ushort *)i_type = *(ushort *)i_type & 0xff | 0x100;
      *(ushort *)e = *(ushort *)e & 0xff00 | 5;
      (e->field_5).field_3.unop = m;
      (e->field_5).field_6.right = (expression *)i_type;
      e->op = 0x2a;
      e->ctype = (symbol *)**(undefined8 **)expr_local;
      *(ushort *)e = *(ushort *)e & 0xff | ((*(ushort *)i_type & *(ushort *)m) >> 8 & 1) << 8;
    }
  }
  if (ctype != (symbol *)0x0) {
    peVar1 = (expression *)
             dmrC_allocator_allocate((allocator *)((long)&expr_local[7].field_5 + 0x10),0);
    memcpy(peVar1,e,0x40);
    if ((undefined1  [232])((undefined1  [232])*ctype & (undefined1  [232])0xff) ==
        (undefined1  [232])0x1e) {
      ctype->next_id = psStack_30;
    }
    psVar2 = dmrC_evaluate_expression((dmr_C *)expr_local,(expression *)ctype);
    if (psVar2 == (symbol *)0x0) {
      return (symbol *)0x0;
    }
    *(ushort *)e = *(ushort *)e & 0xff00 | 5;
    *(ushort *)e = *(ushort *)e & 0xff | ((*(ushort *)ctype & *(ushort *)peVar1) >> 8 & 1) << 8;
    e->op = 0x2b;
    e->ctype = (symbol *)**(undefined8 **)expr_local;
    (e->field_5).field_3.unop = peVar1;
    (e->field_5).field_2.string = (string *)ctype;
  }
  return (symbol *)**(undefined8 **)expr_local;
}

Assistant:

static struct symbol *evaluate_offsetof(struct dmr_C *C, struct expression *expr)
{
	struct expression *e = expr->down;
	struct symbol *ctype = expr->in;
	int klass;

	if (expr->op == '.') {
		struct symbol *field;
		int offset = 0;
		if (!ctype) {
			dmrC_expression_error(C, expr, "expected structure or union");
			return NULL;
		}
		dmrC_examine_symbol_type(C->S, ctype);
		klass = classify_type(C, ctype, &ctype);
		if (klass != TYPE_COMPOUND) {
			dmrC_expression_error(C, expr, "expected structure or union");
			return NULL;
		}

		field = find_identifier(C, expr->ident, ctype->symbol_list, &offset);
		if (!field) {
			dmrC_expression_error(C, expr, "unknown member");
			return NULL;
		}
		ctype = field;
		expr->type = EXPR_VALUE;
		expr->flags = Int_const_expr;
		expr->value = offset;
		expr->taint = 0;
		expr->ctype = C->target->size_t_ctype;
	} else {
		if (!ctype) {
			dmrC_expression_error(C, expr, "expected structure or union");
			return NULL;
		}
		dmrC_examine_symbol_type(C->S, ctype);
		klass = classify_type(C, ctype, &ctype);
		if (klass != (TYPE_COMPOUND | TYPE_PTR)) {
			dmrC_expression_error(C, expr, "expected array");
			return NULL;
		}
		ctype = ctype->ctype.base_type;
		if (!expr->index) {
			expr->type = EXPR_VALUE;
			expr->flags = Int_const_expr;
			expr->value = 0;
			expr->taint = 0;
			expr->ctype = C->target->size_t_ctype;
		} else {
			struct expression *idx = expr->index, *m;
			struct symbol *i_type = dmrC_evaluate_expression(C, idx);
			int i_class = classify_type(C, i_type, &i_type);
			if (!is_int(i_class)) {
				dmrC_expression_error(C, expr, "non-integer index");
				return NULL;
			}
			unrestrict(C, idx, i_class, &i_type);
			idx = cast_to(C, idx, C->target->size_t_ctype);
			m = dmrC_alloc_const_expression(C, expr->pos,
						   dmrC_bits_to_bytes(C->target, ctype->bit_size));
			m->ctype = C->target->size_t_ctype;
			m->flags = Int_const_expr;
			expr->type = EXPR_BINOP;
			expr->left = idx;
			expr->right = m;
			expr->op = '*';
			expr->ctype = C->target->size_t_ctype;
			expr->flags = m->flags & idx->flags & Int_const_expr;
		}
	}
	if (e) {
		struct expression *copy = (struct expression *)dmrC_allocator_allocate(&C->expression_allocator, 0);
		*copy = *expr;
		if (e->type == EXPR_OFFSETOF)
			e->in = ctype;
		if (!dmrC_evaluate_expression(C, e))
			return NULL;
		expr->type = EXPR_BINOP;
		expr->flags = e->flags & copy->flags & Int_const_expr;
		expr->op = '+';
		expr->ctype = C->target->size_t_ctype;
		expr->left = copy;
		expr->right = e;
	}
	return C->target->size_t_ctype;
}